

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O3

REF_STATUS
ref_inflate_interpolate_rail
          (REF_INT n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi,REF_DBL xold,REF_DBL *newyz,REF_DBL *newphi
          )

{
  uint uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_INT i0;
  int local_44;
  REF_DBL local_40;
  REF_DBL *local_38;
  
  local_40 = xold;
  local_38 = newphi;
  if ((xold < *x) || (x[(long)n + -1] < xold)) {
    printf("x range %f %f %f\n");
  }
  uVar1 = ref_sort_search_dbl(n,x,local_40,&local_44);
  if (uVar1 == 0) {
    lVar2 = (long)local_44;
    dVar6 = x[lVar2 + 1] - x[lVar2];
    dVar3 = dVar6 * 1e+20;
    if (dVar3 <= -dVar3) {
      dVar3 = -dVar3;
    }
    dVar4 = local_40 - x[lVar2];
    dVar5 = dVar4;
    if (dVar4 <= -dVar4) {
      dVar5 = -dVar4;
    }
    dVar6 = (double)(-(ulong)(dVar5 < dVar3) & (ulong)(dVar4 / dVar6));
    dVar3 = 0.0;
    if (0.0 <= dVar6) {
      dVar3 = dVar6;
    }
    if (1.0 <= dVar3) {
      dVar3 = 1.0;
    }
    dVar6 = 1.0 - dVar3;
    *newyz = yz[lVar2 * 2] * dVar6 + yz[(local_44 + 1) * 2] * dVar3;
    newyz[1] = yz[local_44 * 2 + 1] * dVar6 + yz[(local_44 + 1) * 2 + 1] * dVar3;
    *local_38 = phi[lVar2] * dVar6 + phi[lVar2 + 1] * dVar3;
    if ((local_40 < *x) || (x[(long)n + -1] <= local_40 && local_40 != x[(long)n + -1])) {
      printf("extrap %f %f %f\n",local_40 - (dVar6 * x[lVar2] + dVar3 * x[lVar2 + 1]));
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x221
           ,"ref_inflate_interpolate_rail",(ulong)uVar1,"rail i0");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_interpolate_rail(
    REF_INT n, REF_DBL *x, REF_DBL *yz, REF_DBL *phi, REF_DBL xold,
    REF_DBL *newyz, REF_DBL *newphi) {
  REF_INT i0, i1;
  REF_DBL t0, t1;
  if (xold < x[0] || x[n - 1] < xold)
    printf("x range %f %f %f\n", x[0], xold, x[n - 1]);
  RSS(ref_sort_search_dbl(n, x, xold, &i0), "rail i0");
  i1 = i0 + 1;
  t1 = 0.0;
  if (ref_math_divisible((xold - x[i0]), (x[i1] - x[i0]))) {
    t1 = (xold - x[i0]) / (x[i1] - x[i0]);
  }
  t1 = MIN(MAX(0.0, t1), 1.0);
  t0 = 1.0 - t1;
  newyz[0] = t0 * yz[0 + 2 * i0] + t1 * yz[0 + 2 * i1];
  newyz[1] = t0 * yz[1 + 2 * i0] + t1 * yz[1 + 2 * i1];
  *newphi = t0 * phi[i0] + t1 * phi[i1];

  if (xold < x[0] || x[(n)-1] < xold)
    printf("extrap %f %f %f\n", xold - (t0 * x[i0] + t1 * x[i1]), xold,
           (t0 * x[i0] + t1 * x[i1]));

  return REF_SUCCESS;
}